

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dims_dynamic_extent.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  unsigned_long local_40;
  int local_34;
  
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(0))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x14,"int main()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x15,"int main()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(2))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x16,"int main()",&local_40,&local_34);
  local_40 = 3;
  local_34 = 3;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(0, 3))","3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x18,"int main()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1, 3))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x19,"int main()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(0, 0))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x1b,"int main()",&local_40,&local_34);
  local_40 = 0;
  boost::detail::test_ne_impl<unsigned_long,unsigned_long>
            ("(dynamic_extent(0, 0))","dyn",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x1c,"int main()",&local_40,&std::experimental::dyn);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1, 0))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x1d,"int main()",&local_40,&local_34);
  local_40 = 0;
  boost::detail::test_ne_impl<unsigned_long,unsigned_long>
            ("(dynamic_extent(1, 0))","dyn",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x1e,"int main()",&local_40,&std::experimental::dyn);
  local_40 = 3;
  local_34 = 3;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(0, 3, 5))","3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x20,"int main()",&local_40,&local_34);
  local_40 = 5;
  local_34 = 5;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1, 3, 5))","5",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x21,"int main()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(2, 3, 5))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x22,"int main()",&local_40,&local_34);
  local_40 = 0xffffffffffffffff;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(dynamic_extent(0, dyn, 5))","dyn",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x24,"int main()",&local_40,&std::experimental::dyn);
  local_40 = 0xffffffffffffffff;
  local_34 = 0;
  boost::detail::test_ne_impl<unsigned_long,int>
            ("(dynamic_extent(0, dyn, 5))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x25,"int main()",&local_40,&local_34);
  local_40 = 5;
  local_34 = 5;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1, dyn, 5))","5",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x26,"int main()",&local_40,&local_34);
  local_40 = 0;
  local_34 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(2, dyn, 5))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x27,"int main()",&local_40,&local_34);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    BOOST_TEST_EQ((dynamic_extent(0)), 0);
    BOOST_TEST_EQ((dynamic_extent(1)), 0);
    BOOST_TEST_EQ((dynamic_extent(2)), 0);
    
    BOOST_TEST_EQ((dynamic_extent(0, 3)), 3);
    BOOST_TEST_EQ((dynamic_extent(1, 3)), 0);

    BOOST_TEST_EQ((dynamic_extent(0, 0)), 0);
    BOOST_TEST_NE((dynamic_extent(0, 0)), dyn);
    BOOST_TEST_EQ((dynamic_extent(1, 0)), 0);
    BOOST_TEST_NE((dynamic_extent(1, 0)), dyn);
    
    BOOST_TEST_EQ((dynamic_extent(0, 3, 5)), 3);
    BOOST_TEST_EQ((dynamic_extent(1, 3, 5)), 5);
    BOOST_TEST_EQ((dynamic_extent(2, 3, 5)), 0);

    BOOST_TEST_EQ((dynamic_extent(0, dyn, 5)), dyn);
    BOOST_TEST_NE((dynamic_extent(0, dyn, 5)), 0);
    BOOST_TEST_EQ((dynamic_extent(1, dyn, 5)), 5);
    BOOST_TEST_EQ((dynamic_extent(2, dyn, 5)), 0);

    return boost::report_errors();
}